

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void crunch(membuf *inbuf,membuf *outbuf,crunch_options *options,crunch_info *info)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long lVar5;
  
  puVar3 = (undefined1 *)inbuf->buf;
  puVar4 = puVar3 + (long)inbuf->len + -1;
  if (puVar3 < puVar4) {
    do {
      puVar2 = puVar3 + 1;
      uVar1 = *puVar3;
      *puVar3 = *puVar4;
      *puVar4 = uVar1;
      puVar4 = puVar4 + -1;
      puVar3 = puVar2;
    } while (puVar2 < puVar4);
  }
  lVar5 = (long)outbuf->len;
  crunch_backwards(inbuf,outbuf,options,info);
  puVar3 = (undefined1 *)inbuf->buf;
  puVar4 = puVar3 + (long)inbuf->len + -1;
  if (puVar3 < puVar4) {
    do {
      puVar2 = puVar3 + 1;
      uVar1 = *puVar3;
      *puVar3 = *puVar4;
      *puVar4 = uVar1;
      puVar4 = puVar4 + -1;
      puVar3 = puVar2;
    } while (puVar2 < puVar4);
  }
  puVar3 = (undefined1 *)((long)outbuf->buf + lVar5);
  puVar4 = puVar3 + (outbuf->len - lVar5) + -1;
  if (puVar3 < puVar4) {
    puVar3 = (undefined1 *)((long)outbuf->buf + lVar5);
    do {
      puVar2 = puVar3 + 1;
      uVar1 = *puVar3;
      *puVar3 = *puVar4;
      *puVar4 = uVar1;
      puVar4 = puVar4 + -1;
      puVar3 = puVar2;
    } while (puVar2 < puVar4);
  }
  return;
}

Assistant:

void crunch(struct membuf *inbuf,
            struct membuf *outbuf,
            struct crunch_options *options, /* IN */
            struct crunch_info *info) /* OUT */
{
    int outpos;
    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    outpos = membuf_memlen(outbuf);

    crunch_backwards(inbuf, outbuf, options, info);

    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    reverse_buffer((char*)membuf_get(outbuf) + outpos,
                   membuf_memlen(outbuf) - outpos);
}